

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

appender __thiscall
fmt::v8::detail::fallback_formatter<my_type,_char,_void>::format<fmt::v8::appender>
          (fallback_formatter<my_type,_char,_void> *this,my_type *value,
          basic_format_context<fmt::v8::appender,_char> *ctx)

{
  basic_string_view<char> s;
  basic_string_view<char> s_00;
  char *s_01;
  size_t count;
  basic_format_context<fmt::v8::appender,_char> *in_RDX;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_RDI;
  basic_string_view<char> str;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  dynamic_format_specs<char> specs;
  allocator<char> *in_stack_fffffffffffffc48;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  basic_format_specs<char> *in_stack_fffffffffffffc68;
  locale_ref in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc78;
  basic_string_view<char> local_358;
  void *local_348;
  allocator<char> local_329;
  basic_format_context<fmt::v8::appender,_char> *in_stack_fffffffffffffcd8;
  int *in_stack_fffffffffffffce0;
  arg_ref<char> in_stack_fffffffffffffcf0;
  my_type *in_stack_fffffffffffffde0;
  buffer<char> *in_stack_fffffffffffffde8;
  locale_ref in_stack_fffffffffffffdf0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_8;
  
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  std::allocator<char>::~allocator(&local_329);
  local_348 = (void *)basic_format_context<fmt::v8::appender,_char>::locale(in_RDX);
  format_value<char,my_type>
            (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdf0);
  s_01 = buffer<char>::data((buffer<char> *)&stack0xfffffffffffffcd8);
  count = buffer<char>::size((buffer<char> *)&stack0xfffffffffffffcd8);
  basic_string_view<char>::basic_string_view(&local_358,s_01,count);
  if (((int)(in_RDI.container)->size_ == 0) && (*(int *)&in_RDI.container[1].ptr_ == 0)) {
    basic_format_context<fmt::v8::appender,_char>::out(in_RDX);
    basic_format_context<fmt::v8::appender,_char>::locale(in_RDX);
    s_00.size_ = (size_t)s_01;
    s_00.data_ = in_stack_fffffffffffffc78;
    local_8.container =
         (buffer<char> *)
         write<char,fmt::v8::appender>
                   (in_RDI.container,s_00,in_stack_fffffffffffffc68,in_stack_fffffffffffffc70);
  }
  else {
    in_stack_fffffffffffffc50 =
         (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)in_RDI.container[1].size_;
    handle_dynamic_spec<fmt::v8::detail::width_checker,fmt::v8::basic_format_context<fmt::v8::appender,char>>
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcf0,in_stack_fffffffffffffcd8);
    handle_dynamic_spec<fmt::v8::detail::precision_checker,fmt::v8::basic_format_context<fmt::v8::appender,char>>
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcf0,in_stack_fffffffffffffcd8);
    basic_format_context<fmt::v8::appender,_char>::out(in_RDX);
    basic_format_context<fmt::v8::appender,_char>::locale(in_RDX);
    s.size_ = (size_t)s_01;
    s.data_ = in_stack_fffffffffffffc78;
    local_8.container =
         (buffer<char> *)
         write<char,fmt::v8::appender>
                   (in_RDI.container,s,in_stack_fffffffffffffc68,in_stack_fffffffffffffc70);
  }
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            (in_stack_fffffffffffffc50);
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_8.container;
}

Assistant:

auto format(const T& value, basic_format_context<OutputIt, Char>& ctx)
      -> OutputIt {
    basic_memory_buffer<Char> buffer;
    format_value(buffer, value, ctx.locale());
    basic_string_view<Char> str(buffer.data(), buffer.size());
    return formatter<basic_string_view<Char>, Char>::format(str, ctx);
  }